

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall GlobOpt::OptTagChecks(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  Sym *pSVar2;
  code *pcVar3;
  anon_class_32_4_be7ea101 fn;
  Value *value_00;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  ValueType VVar7;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar8;
  RegOpnd *this_02;
  RegOpnd *pRVar9;
  byte bVar10;
  _func_int **unaff_R13;
  Opnd *this_03;
  Value *local_50;
  Value *value;
  Instr *bailOutInstr;
  StackSym *stackSym;
  ValueType valueType;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,OptTagChecksPhase,sourceContextId,functionId);
  if ((!bVar4) && ((this->field_0xf7 & 4) != 0)) {
    bailOutInstr = (Instr *)0x0;
    OVar1 = instr->m_opcode;
    pRVar9 = (RegOpnd *)0x0;
    if (OVar1 < BailOnNotObject) {
      if ((OVar1 == LdFld) || (OVar1 == LdMethodFld)) {
LAB_00452431:
        this_03 = instr->m_src1;
      }
      else {
        this_03 = (Opnd *)0x0;
        if (OVar1 != StFld) goto LAB_0045250b;
        this_03 = instr->m_dst;
      }
      OVar5 = IR::Opnd::GetKind(this_03);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_004527c3;
        *puVar8 = 0;
      }
      unaff_R13 = this_03[1]._vptr_Opnd;
      if (*(char *)((long)unaff_R13 + 0x14) != '\x02') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar4) goto LAB_004527c3;
        *puVar8 = 0;
      }
      bailOutInstr = (Instr *)unaff_R13[4];
      pRVar9 = (RegOpnd *)0x0;
    }
    else {
      pRVar9 = (RegOpnd *)0x0;
      if (OVar1 < CheckFixedFld) {
        if ((OVar1 == BailOnNotObject) || (this_03 = (Opnd *)0x0, OVar1 == BailOnNotArray)) {
          OVar5 = IR::Opnd::GetKind(instr->m_src1);
          if (OVar5 == OpndKindReg) {
            pRVar9 = (RegOpnd *)instr->m_src1;
            OVar5 = IR::Opnd::GetKind((Opnd *)pRVar9);
            if (OVar5 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar8 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar4) goto LAB_004527c3;
              *puVar8 = 0;
            }
            bailOutInstr = (Instr *)pRVar9->m_sym;
          }
          else {
            pRVar9 = (RegOpnd *)0x0;
          }
          this_03 = (Opnd *)0x0;
        }
      }
      else if ((OVar1 == CheckPropertyGuardAndLoadType) ||
              (this_03 = (Opnd *)0x0, OVar1 == CheckFixedFld)) goto LAB_00452431;
    }
LAB_0045250b:
    bVar10 = (byte)unaff_R13;
    if (bailOutInstr != (Instr *)0x0) {
      local_50 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,(Sym *)bailOutInstr);
      if (local_50 == (Value *)0x0) {
        bVar4 = true;
      }
      else {
        pSVar2 = local_50->valueInfo->symStore;
        if (((pSVar2 == (Sym *)0x0) || (pSVar2->m_kind != SymKindStack)) ||
           (((ulong)pSVar2[1]._vptr_Sym & 0x40000) == 0)) {
          stackSym._6_2_ = (local_50->valueInfo->super_ValueType).field_0;
          OVar1 = instr->m_opcode;
          this_02 = (RegOpnd *)(ulong)OVar1;
          bVar4 = OVar1 != BailOnNotObject;
          bVar6 = ValueType::CanBeTaggedValue((ValueType *)((long)&stackSym + 6));
          value_00 = local_50;
          if (OVar1 == BailOnNotObject) {
            if (bVar6) {
              this_02 = (RegOpnd *)0x0;
              VVar7 = ValueType::SetCanBeTaggedValue((ValueType *)((long)&stackSym + 6),false);
              ChangeValueType(this,(BasicBlock *)0x0,value_00,VVar7,true,false);
            }
            else {
              this_02 = (RegOpnd *)&DAT_00000001;
              if (this->prePassLoop == (Loop *)0x0) {
                if (this->byteCodeUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
                  InsertByteCodeUses(this,instr,false);
                }
                BasicBlock::RemoveInstr(this->currentBlock,instr);
              }
            }
          }
          else if (bVar6) {
            bVar6 = ValueType::HasBeenNumber((ValueType *)((long)&stackSym + 6));
            if ((!bVar6) && (this->prePassLoop == (Loop *)0x0)) {
              VVar7 = ValueType::SetCanBeTaggedValue((ValueType *)((long)&stackSym + 6),false);
              value = (Value *)IR::BailOutInstrTemplate<IR::Instr>::New
                                         (BailOnNotObject,BailOutOnTaggedValue,instr,instr->m_func);
              if (this->prePassLoop == (Loop *)0x0) {
                FillBailOutInfo(this,this->currentBlock,(Instr *)value);
              }
              this_02 = pRVar9;
              if (pRVar9 == (RegOpnd *)0x0) {
                this_02 = IR::RegOpnd::New((StackSym *)bailOutInstr,
                                           *(IRType *)((long)&bailOutInstr->m_prev + 4),
                                           instr->m_func);
                if (this_03 == (Opnd *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  *puVar8 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0xb84,"(symOpnd)","symOpnd");
                  if (!bVar6) {
LAB_004527c3:
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  *puVar8 = 0;
                }
                if ((this_03->field_0xb & 8) != 0) {
                  IR::Opnd::SetIsJITOptimizedReg(&this_02->super_Opnd,true);
                }
              }
              IR::Instr::SetSrc1((Instr *)value,&this_02->super_Opnd);
              IR::Opnd::SetValueType((Opnd *)value[4].valueInfo,(ValueType)stackSym._6_2_);
              IR::Instr::SetByteCodeOffset((Instr *)value,instr);
              IR::Instr::InsertBefore(instr,(Instr *)value);
              if (this->currentBlock->loop != (Loop *)0x0) {
                fn.bailOutInstr = (Instr **)&value;
                fn.this = this;
                fn.value = &local_50;
                fn.stackSym = (StackSym **)&bailOutInstr;
                TrackByteCodeUsesForInstrAddedInOptInstr<GlobOpt::OptTagChecks(IR::Instr*)::__0>
                          (this,(Instr *)value,fn);
              }
              if (this_03 == (Opnd *)0x0) {
                IR::Opnd::SetValueType(&pRVar9->super_Opnd,VVar7);
              }
              else {
                *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&this_03[1].m_kind =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     VVar7.field_0;
              }
              ChangeValueType(this,(BasicBlock *)0x0,local_50,VVar7,false,false);
            }
          }
          bVar10 = (byte)this_02;
        }
        else {
          bVar4 = false;
          bVar10 = 0;
        }
      }
      if (!bVar4) goto LAB_004527ad;
    }
  }
  bVar10 = 0;
LAB_004527ad:
  return (bool)(bVar10 & 1);
}

Assistant:

bool
GlobOpt::OptTagChecks(IR::Instr *instr)
{
    if (PHASE_OFF(Js::OptTagChecksPhase, this->func) || !this->DoTagChecks())
    {
        return false;
    }

    StackSym *stackSym = nullptr;
    IR::SymOpnd *symOpnd = nullptr;
    IR::RegOpnd *regOpnd = nullptr;

    switch(instr->m_opcode)
    {
    case Js::OpCode::LdFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::CheckFixedFld:
    case Js::OpCode::CheckPropertyGuardAndLoadType:
        symOpnd = instr->GetSrc1()->AsSymOpnd();
        stackSym = symOpnd->m_sym->AsPropertySym()->m_stackSym;
        break;

    case Js::OpCode::BailOnNotObject:
    case Js::OpCode::BailOnNotArray:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            regOpnd = instr->GetSrc1()->AsRegOpnd();
            stackSym = regOpnd->m_sym;
        }
        break;

    case Js::OpCode::StFld:
        symOpnd = instr->GetDst()->AsSymOpnd();
        stackSym = symOpnd->m_sym->AsPropertySym()->m_stackSym;
        break;
    }

    if (stackSym)
    {
        Value *value = CurrentBlockData()->FindValue(stackSym);
        if (value)
        {
            ValueInfo *valInfo = value->GetValueInfo();
            if (valInfo->GetSymStore() && valInfo->GetSymStore()->IsStackSym() && valInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
            {
                return false;
            }
            ValueType valueType = value->GetValueInfo()->Type();
            if (instr->m_opcode == Js::OpCode::BailOnNotObject)
            {
                if (valueType.CanBeTaggedValue())
                {
                    // We're not adding new information to the value other than changing the value type. Preserve any existing
                    // information and just change the value type.
                    ChangeValueType(nullptr, value, valueType.SetCanBeTaggedValue(false), true /*preserveSubClassInfo*/);
                    return false;
                }
                if (!this->IsLoopPrePass())
                {
                    if (this->byteCodeUses)
                    {
                        this->InsertByteCodeUses(instr);
                    }
                    this->currentBlock->RemoveInstr(instr);
                }
                return true;
            }

            if (valueType.CanBeTaggedValue() &&
                !valueType.HasBeenNumber() &&
                !this->IsLoopPrePass())
            {
                ValueType newValueType = valueType.SetCanBeTaggedValue(false);

                // Split out the tag check as a separate instruction.
                IR::Instr *bailOutInstr;
                bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotObject, IR::BailOutOnTaggedValue, instr, instr->m_func);
                if (!this->IsLoopPrePass())
                {
                    FillBailOutInfo(this->currentBlock, bailOutInstr);
                }
                IR::RegOpnd *srcOpnd = regOpnd;
                if (!srcOpnd)
                {
                    srcOpnd = IR::RegOpnd::New(stackSym, stackSym->GetType(), instr->m_func);
                    AnalysisAssert(symOpnd);
                    if (symOpnd->GetIsJITOptimizedReg())
                    {
                        srcOpnd->SetIsJITOptimizedReg(true);
                    }
                }
                bailOutInstr->SetSrc1(srcOpnd);
                bailOutInstr->GetSrc1()->SetValueType(valueType);
                bailOutInstr->SetByteCodeOffset(instr);
                instr->InsertBefore(bailOutInstr);
                if (this->currentBlock->loop)
                {
                    // Try hoisting the BailOnNotObject instr.
                    // But since this isn't the current instr being optimized, we need to play tricks with
                    // the byteCodeUse fields...
                    TrackByteCodeUsesForInstrAddedInOptInstr(bailOutInstr, [&]()
                    {
                        if (TryHoistInvariant(bailOutInstr, this->currentBlock, nullptr, value, nullptr, true, false, false, IR::BailOutOnTaggedValue))
                        {
                            Value* landingPadValue = this->currentBlock->loop->landingPad->globOptData.FindValue(stackSym);
                            ValueType newLandingPadValueType = landingPadValue->GetValueInfo()->Type().SetCanBeTaggedValue(false);
                            ChangeValueType(nullptr, landingPadValue, newLandingPadValueType, false);
                        }
                    });
                }
                if (symOpnd)
                {
                    symOpnd->SetPropertyOwnerValueType(newValueType);
                }
                else
                {
                    regOpnd->SetValueType(newValueType);
                }
                ChangeValueType(nullptr, value, newValueType, false);
            }
        }
    }

    return false;
}